

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

iterator __thiscall
phmap::priv::
btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
::internal_emplace<phmap::test_internal::MovableOnlyInstance>
          (btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
           *this,iterator iter,MovableOnlyInstance *args)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
  *this_00;
  iterator iVar4;
  iterator iter_local;
  
  this_00 = iter.node;
  iter_local.position = iter.position;
  iter_local.node = this_00;
  bVar1 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
          ::leaf(this_00);
  if (!bVar1) {
    btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>,_phmap::test_internal::MovableOnlyInstance_&,_phmap::test_internal::MovableOnlyInstance_*>
    ::decrement(&iter_local);
    iter_local.position = iter_local.position + 1;
    this_00 = iter_local.node;
  }
  bVar2 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
          ::max_count(this_00);
  bVar3 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
          ::count(iter_local.node);
  if (bVar3 == bVar2) {
    if (bVar2 < 0x3d) {
      if (iter_local.node !=
          (this->root_).
          super__Tuple_impl<0UL,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*>
          .
          super__Tuple_impl<1UL,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*>
          .
          super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*>
          .
          super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*,_false>
          ._M_head_impl) {
        __assert_fail("iter.node == root()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xc27,
                      "iterator phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, std::allocator<phmap::test_internal::MovableOnlyInstance>, 992, false>>::internal_emplace(iterator, Args &&...) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, std::allocator<phmap::test_internal::MovableOnlyInstance>, 992, false>, Args = <phmap::test_internal::MovableOnlyInstance>]"
                     );
      }
      bVar3 = 0x3d;
      if ((byte)(bVar2 * '\x02') < 0x3d) {
        bVar3 = bVar2 * '\x02';
      }
      iter_local.node = new_leaf_root_node(this,(uint)bVar3);
      btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
      ::swap(iter_local.node,
             (this->root_).
             super__Tuple_impl<0UL,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*>
             .
             super__Tuple_impl<1UL,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*>
             .
             super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*>
             .
             super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*,_false>
             ._M_head_impl,(allocator_type *)this);
      delete_leaf_node(this,(this->root_).
                            super__Tuple_impl<0UL,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*>
                            .
                            super__Tuple_impl<1UL,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*>
                            .
                            super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*>
                            .
                            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*,_false>
                            ._M_head_impl);
      (this->root_).
      super__Tuple_impl<0UL,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*>
      .
      super__Tuple_impl<1UL,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*>
      .
      super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*>
      .
      super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*,_false>
      ._M_head_impl = iter_local.node;
      this->rightmost_ = iter_local.node;
    }
    else {
      rebalance_or_split(this,&iter_local);
    }
  }
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
  ::emplace_value<phmap::test_internal::MovableOnlyInstance>
            (iter_local.node,(long)iter_local.position,(allocator_type *)this,args);
  this->size_ = this->size_ + 1;
  iVar4.position = iter_local.position;
  iVar4.node = iter_local.node;
  iVar4._12_4_ = 0;
  return iVar4;
}

Assistant:

inline auto btree<P>::internal_emplace(iterator iter, Args &&... args)
        -> iterator {
        if (!iter.node->leaf()) {
            // We can't insert on an internal node. Instead, we'll insert after the
            // previous value which is guaranteed to be on a leaf node.
            --iter;
            ++iter.position;
        }
        const int max_count = iter.node->max_count();
        if (iter.node->count() == max_count) {
            // Make room in the leaf for the new item.
            if (max_count < kNodeValues) {
                // Insertion into the root where the root is smaller than the full node
                // size. Simply grow the size of the root node.
                assert(iter.node == root());
                iter.node =
                    new_leaf_root_node((std::min<int>)(kNodeValues, 2 * max_count));
                iter.node->swap(root(), mutable_allocator());
                delete_leaf_node(root());
                mutable_root() = iter.node;
                rightmost_ = iter.node;
            } else {
                rebalance_or_split(&iter);
            }
        }
        iter.node->emplace_value(iter.position, mutable_allocator(),
                                 std::forward<Args>(args)...);
        ++size_;
        return iter;
    }